

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLUri::buildFullText(XMLUri *this)

{
  short *psVar1;
  XMLCh *src;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  XMLCh *pXVar7;
  long lVar8;
  long lVar9;
  XMLCh *pXVar10;
  XMLCh *target;
  XMLCh tmpBuf [17];
  XMLCh local_48 [20];
  
  if (this->fScheme == (XMLCh *)0x0) {
    lVar3 = 5;
  }
  else {
    lVar3 = 0;
    do {
      psVar1 = (short *)((long)this->fScheme + lVar3);
      lVar3 = lVar3 + 2;
    } while (*psVar1 != 0);
    lVar3 = (lVar3 >> 1) + 4;
  }
  lVar4 = 0;
  if (this->fFragment != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fFragment + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    lVar4 = (lVar4 >> 1) + -1;
  }
  pXVar10 = this->fHost;
  if (pXVar10 == (XMLCh *)0x0) {
    pXVar10 = this->fRegAuth;
  }
  lVar9 = 0;
  if (pXVar10 != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)pXVar10 + lVar9);
      lVar9 = lVar9 + 2;
    } while (*psVar1 != 0);
    lVar9 = (lVar9 >> 1) + -1;
  }
  lVar5 = 0;
  if (this->fPath != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fPath + lVar5);
      lVar5 = lVar5 + 2;
    } while (*psVar1 != 0);
    lVar5 = (lVar5 >> 1) + -1;
  }
  lVar6 = 0;
  if (this->fQueryString != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fQueryString + lVar6);
      lVar6 = lVar6 + 2;
    } while (*psVar1 != 0);
    lVar6 = (lVar6 >> 1) + -1;
  }
  lVar8 = 0;
  if (this->fUserInfo != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fUserInfo + lVar8);
      lVar8 = lVar8 + 2;
    } while (*psVar1 != 0);
    lVar8 = (lVar8 >> 1) + -1;
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fURIText);
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(lVar9 + lVar5 + lVar3 + lVar4 + lVar6 + lVar8) * 2 + 0x42
                    );
  pXVar10 = (XMLCh *)CONCAT44(extraout_var,iVar2);
  this->fURIText = pXVar10;
  *pXVar10 = L'\0';
  if (this->fScheme != (XMLCh *)0x0) {
    XMLString::catString(pXVar10,this->fScheme);
    lVar3 = 0;
    if (this->fURIText != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fURIText + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10[lVar3] = L':';
    pXVar10 = pXVar10 + lVar3 + 1;
  }
  pXVar7 = this->fHost;
  src = this->fRegAuth;
  if (pXVar7 != (XMLCh *)0x0 || src != (XMLCh *)0x0) {
    target = pXVar10 + 2;
    pXVar10[0] = L'/';
    pXVar10[1] = L'/';
    if (pXVar7 == (XMLCh *)0x0) {
      XMLString::copyString(target,src);
      lVar3 = 0;
      if (this->fRegAuth != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)this->fRegAuth + lVar3);
          lVar3 = lVar3 + 2;
        } while (*psVar1 != 0);
        lVar3 = (lVar3 >> 1) + -1;
      }
      pXVar10 = target + lVar3;
    }
    else {
      if (this->fUserInfo != (XMLCh *)0x0) {
        XMLString::copyString(target,this->fUserInfo);
        lVar3 = 0;
        if (this->fUserInfo != (XMLCh *)0x0) {
          do {
            psVar1 = (short *)((long)this->fUserInfo + lVar3);
            lVar3 = lVar3 + 2;
          } while (*psVar1 != 0);
          lVar3 = (lVar3 >> 1) + -1;
        }
        pXVar10 = target + lVar3;
        target = pXVar10 + 1;
        *pXVar10 = L'@';
        pXVar7 = this->fHost;
      }
      XMLString::copyString(target,pXVar7);
      lVar3 = 0;
      if (this->fHost != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)this->fHost + lVar3);
          lVar3 = lVar3 + 2;
        } while (*psVar1 != 0);
        lVar3 = (lVar3 >> 1) + -1;
      }
      pXVar10 = target + lVar3;
      iVar2 = this->fPort;
      if (iVar2 != -1) {
        *pXVar10 = L':';
        XMLString::binToText(iVar2,local_48,0x10,10,this->fMemoryManager);
        XMLString::copyString(pXVar10 + 1,local_48);
        lVar3 = 0;
        do {
          psVar1 = (short *)((long)local_48 + lVar3);
          lVar3 = lVar3 + 2;
        } while (*psVar1 != 0);
        pXVar10 = (XMLCh *)((long)pXVar10 + lVar3);
      }
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    XMLString::copyString(pXVar10,this->fPath);
    lVar3 = 0;
    if (this->fPath != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fPath + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10 = pXVar10 + lVar3;
  }
  pXVar7 = this->fQueryString;
  if (pXVar7 != (XMLCh *)0x0) {
    *pXVar10 = L'?';
    XMLString::copyString(pXVar10 + 1,pXVar7);
    lVar3 = 0;
    if (this->fQueryString != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fQueryString + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10 = pXVar10 + 1 + lVar3;
  }
  pXVar7 = this->fFragment;
  if (pXVar7 != (XMLCh *)0x0) {
    *pXVar10 = L'#';
    XMLString::copyString(pXVar10 + 1,pXVar7);
    lVar3 = 0;
    if (this->fFragment != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fFragment + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    pXVar10 = pXVar10 + 1 + lVar3;
  }
  *pXVar10 = L'\0';
  return;
}

Assistant:

void XMLUri::buildFullText()
{
    // Calculate the worst case size of the buffer required
    XMLSize_t bufSize = XMLString::stringLen(fScheme) + 1
                           + XMLString::stringLen(fFragment) + 1
                           + XMLString::stringLen(fHost ? fHost : fRegAuth) + 2
                           + XMLString::stringLen(fPath)
                           + XMLString::stringLen(fQueryString) + 1
                           + XMLString::stringLen(fUserInfo) + 1
                           + 32;

    // Clean up the existing buffer and allocate another
    fMemoryManager->deallocate(fURIText);//delete [] fURIText;
    fURIText = (XMLCh*) fMemoryManager->allocate(bufSize * sizeof(XMLCh));//new XMLCh[bufSize];
    *fURIText = 0;

    XMLCh* outPtr = fURIText;
    if (fScheme != 0)
    {
        XMLString::catString(fURIText, getScheme());
        outPtr += XMLString::stringLen(fURIText);
        *outPtr++ = chColon;
    }

    // Authority
    if (fHost || fRegAuth)
    {
        *outPtr++ = chForwardSlash;
        *outPtr++ = chForwardSlash;

        // Server based authority.
        if (fHost)
        {
            if (fUserInfo)
            {
                XMLString::copyString(outPtr, fUserInfo);
                outPtr += XMLString::stringLen(fUserInfo);
                *outPtr++ = chAt;
            }

            XMLString::copyString(outPtr, fHost);
            outPtr += XMLString::stringLen(fHost);

            //
            //  If the port is -1, then we don't put it in. Else we need
            //  to because it was explicitly provided.
            //
            if (fPort != -1)
            {
                *outPtr++ = chColon;

                XMLCh tmpBuf[17];
                XMLString::binToText(fPort, tmpBuf, 16, 10, fMemoryManager);
                XMLString::copyString(outPtr, tmpBuf);
                outPtr += XMLString::stringLen(tmpBuf);
            }
        }
        // Registry based authority.
        else {
            XMLString::copyString(outPtr, fRegAuth);
            outPtr += XMLString::stringLen(fRegAuth);
        }
    }

    if (fPath)
    {
        XMLString::copyString(outPtr, fPath);
        outPtr += XMLString::stringLen(fPath);
    }

    if (fQueryString)
    {
        *outPtr++ = chQuestion;
        XMLString::copyString(outPtr, fQueryString);
        outPtr += XMLString::stringLen(fQueryString);
    }

    if (fFragment)
    {
        *outPtr++ = chPound;
        XMLString::copyString(outPtr, fFragment);
        outPtr += XMLString::stringLen(fFragment);
    }

    // Cap it off in case the last op was not a string copy
    *outPtr = 0;
}